

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O3

string * make_objdesc_abi_cxx11_
                   (string *__return_storage_ptr__,qpdf_offset_t offset,QPDFObjectHandle *obj)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  stringstream ss;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"offset = ",9);
  poVar3 = std::ostream::_M_insert<long_long>((longlong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (0x",4);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"), ",3);
  cVar1 = QPDFObjectHandle::isIndirect();
  if (cVar1 == '\0') {
    lVar5 = 8;
    pcVar6 = "direct, ";
    poVar3 = (ostream *)local_1a0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"indirect ",9);
    iVar2 = QPDFObjectHandle::getObjectID();
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
    iVar2 = QPDFObjectHandle::getGeneration();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    lVar5 = 2;
    pcVar6 = ", ";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
  pcVar6 = (char *)QPDFObjectHandle::getTypeName();
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar6,sVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string
make_objdesc(qpdf_offset_t offset, QPDFObjectHandle obj)
{
    std::stringstream ss;
    ss << "offset = " << offset << " (0x" << std::hex << offset << std::dec << "), ";

    if (obj.isIndirect()) {
        ss << "indirect " << obj.getObjectID() << "/" << obj.getGeneration() << ", ";
    } else {
        ss << "direct, ";
    }

    ss << obj.getTypeName();

    return ss.str();
}